

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<long_double> * __thiscall Fad<long_double>::operator*=(Fad<long_double> *this,longdouble *val)

{
  int iVar1;
  longdouble *plVar2;
  longdouble *in_RSI;
  Fad<long_double> *in_RDI;
  int i;
  longdouble *dxp;
  int sz;
  int local_24;
  
  in_RDI->val_ = in_RDI->val_ * *in_RSI;
  iVar1 = Vector<long_double>::size((Vector<long_double> *)0x10ba3ee);
  if (iVar1 != 0) {
    plVar2 = Vector<long_double>::begin(&in_RDI->dx_);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      plVar2[local_24] = plVar2[local_24] * *in_RSI;
    }
  }
  return in_RDI;
}

Assistant:

inline  Fad<T> & Fad<T>::operator*= (const T& val)
{
  val_ *= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] *= val;
  }

  return *this;
}